

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::insert
          (QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *this,
          _List_iterator<QString> *key,_List_iterator<Rule> *value)

{
  bool bVar1;
  QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
  *pQVar2;
  _List_iterator<Rule> *in_RDX;
  _List_iterator<QString> *in_RSI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> copy;
  multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
  *in_stack_ffffffffffffff88;
  iterator it;
  QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *in_stack_ffffffffffffff90;
  pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *this_00;
  const_iterator in_stack_ffffffffffffffa8;
  pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_> local_38;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff90->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff90,
              (QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *)
              in_stack_ffffffffffffff88);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *)0x122b32);
  }
  detach(in_stack_ffffffffffffff90);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
                *)0x122b55);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
       ::lower_bound(in_stack_ffffffffffffff88,(key_type *)0x122b66);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
                         *)0x122b75);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_20);
  this_00 = &local_38;
  std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::
  pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>,_true>(this_00,in_RSI,in_RDX);
  std::
  multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
  ::insert((multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
            *)this_00,in_stack_ffffffffffffffa8,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x122bcc,it);
  ~QMultiMap((QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *)0x122bd6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }